

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

void FreeEpoll(stCoEpoll_t *ctx)

{
  stTimeout_t *__ptr;
  
  if (ctx != (stCoEpoll_t *)0x0) {
    free(ctx->pstActiveList);
    free(ctx->pstTimeoutList);
    __ptr = ctx->pTimeout;
    free(__ptr->pItems);
    free(__ptr);
    co_epoll_res_free(ctx->result);
  }
  free(ctx);
  return;
}

Assistant:

void FreeEpoll( stCoEpoll_t *ctx )
{
	if( ctx )
	{
		free( ctx->pstActiveList );
		free( ctx->pstTimeoutList );
		FreeTimeout( ctx->pTimeout );
		co_epoll_res_free( ctx->result );
	}
	free( ctx );
}